

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iomapper.cpp
# Opt level: O3

void __thiscall
glslang::TSymbolValidater::TSymbolValidater
          (TSymbolValidater *this,TIoMapResolver *r,TInfoSink *i,TVarLiveMap **in,TVarLiveMap **out,
          TVarLiveMap **uniform,bool *hadError,EProfile profile,int version)

{
  TPoolAllocator *pTVar1;
  TVarLiveMap *pTVar2;
  bool bVar3;
  TRange TVar4;
  _Base_ptr p_Var5;
  undefined8 __s;
  uint uVar6;
  char cVar7;
  int iVar8;
  uint uVar9;
  TType *type;
  basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *pbVar10;
  _Base_ptr p_Var11;
  long lVar12;
  iterator iVar13;
  mapped_type *pmVar14;
  long *plVar15;
  long lVar16;
  char *pcVar17;
  ulong uVar18;
  TSymbolValidater *pTVar19;
  TVarLiveMap **ppTVar20;
  uint uVar21;
  uint uVar22;
  long lVar23;
  TString err_2;
  vector<glslang::TRange,_std::allocator<glslang::TRange>_> usedUniformLocation;
  TString err;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>_>
  usedUniformName;
  TString symbolName;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>
  uniformVar;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>_>_>
  anonymousMemberMap;
  bool local_1e9;
  TSymbolValidater *local_1e8;
  TRange local_1e0;
  pool_allocator<char> local_1d8;
  undefined1 local_1d0 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_11
  aStack_1b8;
  tHeader **local_1a8 [2];
  tHeader *local_198 [2];
  vector<glslang::TRange,_std::allocator<glslang::TRange>_> local_188;
  key_type local_168;
  TVarLiveMap **local_140;
  long local_138;
  _Rb_tree_node_base *local_130;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>_>
  local_128;
  value_type local_108;
  TPoolAllocator *local_e0;
  undefined1 *local_d8;
  undefined1 local_c8 [16];
  undefined4 local_b8;
  undefined4 uStack_b4;
  undefined4 uStack_b0;
  undefined4 uStack_ac;
  undefined4 local_a8;
  undefined4 uStack_a4;
  _Rb_tree_color _Stack_a0;
  undefined4 uStack_9c;
  undefined4 local_98;
  undefined4 uStack_94;
  undefined4 uStack_90;
  undefined4 uStack_8c;
  TString local_88;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>_>_>
  local_60;
  
  this->resolver = r;
  this->infoSink = i;
  this->hadError = hadError;
  this->profile = profile;
  this->version = version;
  pTVar19 = this;
  for (lVar16 = 0xe; lVar16 != 0; lVar16 = lVar16 + -1) {
    pTVar19->inVarMaps[0] = *in;
    in = in + 1;
    pTVar19 = (TSymbolValidater *)(pTVar19->inVarMaps + 1);
  }
  ppTVar20 = this->outVarMaps;
  for (lVar16 = 0xe; lVar16 != 0; lVar16 = lVar16 + -1) {
    *ppTVar20 = *out;
    out = out + 1;
    ppTVar20 = ppTVar20 + 1;
  }
  local_140 = this->uniformVarMap;
  ppTVar20 = local_140;
  for (lVar16 = 0xe; lVar16 != 0; lVar16 = lVar16 + -1) {
    *ppTVar20 = *uniform;
    uniform = uniform + 1;
    ppTVar20 = ppTVar20 + 1;
  }
  local_60._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_60._M_impl.super__Rb_tree_header._M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  lVar16 = 0;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_188.super__Vector_base<glslang::TRange,_std::allocator<glslang::TRange>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (TRange *)0x0;
  local_188.super__Vector_base<glslang::TRange,_std::allocator<glslang::TRange>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_188.super__Vector_base<glslang::TRange,_std::allocator<glslang::TRange>_>._M_impl.
  super__Vector_impl_data._M_finish = (TRange *)0x0;
  local_128.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_128.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_128.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1e8 = this;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right =
       local_60._M_impl.super__Rb_tree_header._M_header._M_left;
LAB_003f2534:
  pTVar2 = local_140[lVar16];
  local_138 = lVar16;
  if (pTVar2 != (TVarLiveMap *)0x0) {
    p_Var11 = (pTVar2->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
    local_130 = &(pTVar2->_M_t)._M_impl.super__Rb_tree_header._M_header;
    if (p_Var11 != local_130) {
      do {
        local_e0 = GetThreadPoolAllocator();
        local_d8 = local_c8;
        std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
        _M_construct<char*>((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>
                             *)&local_e0,p_Var11[1]._M_parent,
                            (long)&(p_Var11[1]._M_parent)->_M_color +
                            (long)&(p_Var11[1]._M_left)->_M_color);
        local_b8 = *(undefined4 *)&p_Var11[2]._M_parent;
        uStack_b4 = *(undefined4 *)((long)&p_Var11[2]._M_parent + 4);
        uStack_b0 = *(undefined4 *)&p_Var11[2]._M_left;
        uStack_ac = *(undefined4 *)((long)&p_Var11[2]._M_left + 4);
        p_Var5 = p_Var11[2]._M_left;
        local_a8 = *(undefined4 *)&p_Var11[2]._M_right;
        uStack_a4 = *(undefined4 *)((long)&p_Var11[2]._M_right + 4);
        _Stack_a0 = p_Var11[3]._M_color;
        uStack_9c = *(undefined4 *)&p_Var11[3].field_0x4;
        local_98 = *(undefined4 *)&p_Var11[3]._M_parent;
        uStack_94 = *(undefined4 *)((long)&p_Var11[3]._M_parent + 4);
        uStack_90 = *(undefined4 *)&p_Var11[3]._M_left;
        uStack_8c = *(undefined4 *)((long)&p_Var11[3]._M_left + 4);
        lVar16 = (**(code **)(*(long *)p_Var5 + 0x108))(p_Var5);
        uVar22 = *(uint *)(lVar16 + 0x1c) & 0xfff;
        lVar16 = (**(code **)(*(long *)p_Var5 + 0x1a0))(p_Var5);
        local_108._M_dataplus.super_allocator_type.allocator = GetThreadPoolAllocator();
        local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
        std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
        _M_construct<char*>((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>
                             *)&local_108,*(long *)(lVar16 + 8),
                            *(long *)(lVar16 + 0x10) + *(long *)(lVar16 + 8));
        if (uVar22 != 0xfff) {
          type = (TType *)(**(code **)(*(long *)p_Var5 + 0xf0))(p_Var5);
          iVar8 = TIntermediate::computeTypeUniformLocationSize(type);
          local_1e0.last = iVar8 + uVar22 + -1;
          local_1e9 = false;
          local_1e0.start = uVar22;
          local_88._M_dataplus.super_allocator_type.allocator = GetThreadPoolAllocator();
          local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
          std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
          _M_construct<char*>((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>
                               *)&local_88,local_108._M_dataplus._M_p,
                              local_108._M_dataplus._M_p + local_108._M_string_length);
          uVar22 = checkLocationOverlap
                             (local_1e8,&local_1e0,&local_188,&local_88,&local_128,&local_1e9);
          if (uVar22 == 0xffffffff) {
            if (local_188.super__Vector_base<glslang::TRange,_std::allocator<glslang::TRange>_>.
                _M_impl.super__Vector_impl_data._M_finish ==
                local_188.super__Vector_base<glslang::TRange,_std::allocator<glslang::TRange>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage) {
              std::vector<glslang::TRange,std::allocator<glslang::TRange>>::
              _M_realloc_insert<glslang::TRange_const&>
                        ((vector<glslang::TRange,std::allocator<glslang::TRange>> *)&local_188,
                         (iterator)
                         local_188.
                         super__Vector_base<glslang::TRange,_std::allocator<glslang::TRange>_>.
                         _M_impl.super__Vector_impl_data._M_finish,&local_1e0);
            }
            else {
              TVar4.last = local_1e0.last;
              TVar4.start = local_1e0.start;
              *local_188.super__Vector_base<glslang::TRange,_std::allocator<glslang::TRange>_>.
               _M_impl.super__Vector_impl_data._M_finish = TVar4;
              local_188.super__Vector_base<glslang::TRange,_std::allocator<glslang::TRange>_>.
              _M_impl.super__Vector_impl_data._M_finish =
                   local_188.super__Vector_base<glslang::TRange,_std::allocator<glslang::TRange>_>.
                   _M_impl.super__Vector_impl_data._M_finish + 1;
            }
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>_>
            ::push_back(&local_128,&local_108);
          }
          else if (-1 < (int)uVar22) {
            if (local_1e9 != true) {
              uVar21 = 1;
              if (uVar22 < 10) goto LAB_003f2a01;
              uVar9 = uVar22;
              uVar6 = 4;
              goto LAB_003f297a;
            }
            uVar21 = 1;
            if (uVar22 < 10) goto LAB_003f29b9;
            uVar9 = uVar22;
            uVar6 = 4;
            goto LAB_003f291f;
          }
        }
        iVar8 = (**(code **)(*(long *)CONCAT44(uStack_ac,uStack_b0) + 0x100))();
        if (iVar8 == 0x10) {
          pbVar10 = (basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)
                    (**(code **)(*(long *)CONCAT44(uStack_ac,uStack_b0) + 400))();
          iVar8 = std::__cxx11::
                  basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
                  compare(pbVar10,0,5,"anon@");
          if (iVar8 == 0) {
            plVar15 = (long *)(**(code **)(*(long *)CONCAT44(uStack_ac,uStack_b0) + 0xf0))();
            cVar7 = (**(code **)(*plVar15 + 0x128))(plVar15);
            if (cVar7 == '\0') {
              __assert_fail("isStruct()",
                            "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/MachineIndependent/../Include/Types.h"
                            ,0x9df,"const TTypeList *glslang::TType::getStruct() const");
            }
            lVar16 = plVar15[0xd];
            lVar12 = *(long *)(lVar16 + 8);
            if (*(long *)(lVar16 + 0x10) != lVar12) {
              lVar23 = 0;
              uVar18 = 0;
              do {
                lVar12 = (**(code **)(**(long **)(lVar12 + lVar23) + 0x30))();
                local_168._M_dataplus.super_allocator_type.allocator = GetThreadPoolAllocator();
                local_168._M_dataplus._M_p = (pointer)&local_168.field_2;
                std::__cxx11::
                basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
                _M_construct<char*>((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>
                                     *)&local_168,*(long *)(lVar12 + 8),
                                    *(long *)(lVar12 + 0x10) + *(long *)(lVar12 + 8));
                iVar13 = std::
                         _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>_>_>
                         ::find(&local_60,&local_168);
                if ((_Rb_tree_header *)iVar13._M_node == &local_60._M_impl.super__Rb_tree_header) {
                  plVar15 = (long *)(**(code **)(*(long *)CONCAT44(uStack_ac,uStack_b0) + 0xf0))();
                  pbVar10 = (basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                             *)(**(code **)(*plVar15 + 0x28))(plVar15);
                  pmVar14 = std::
                            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>_>_>
                            ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>_>_>
                                          *)&local_60,&local_168);
                  std::__cxx11::
                  basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
                  _M_assign(pmVar14,pbVar10);
                }
                else {
                  pmVar14 = std::
                            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>_>_>
                            ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>_>_>
                                          *)&local_60,&local_168);
                  plVar15 = (long *)(**(code **)(*(long *)CONCAT44(uStack_ac,uStack_b0) + 0xf0))();
                  pbVar10 = (basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                             *)(**(code **)(*plVar15 + 0x28))(plVar15);
                  iVar8 = std::__cxx11::
                          basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                          ::compare(pmVar14,pbVar10);
                  if (iVar8 != 0) {
                    std::operator+((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                                    *)local_1d0,"Invalid block member name: ",&local_168);
                    TInfoSinkBase::message
                              (&local_1e8->infoSink->info,EPrefixInternalError,
                               (char *)local_1d0._8_8_);
                    *hadError = true;
                    break;
                  }
                }
                uVar18 = uVar18 + 1;
                lVar12 = *(long *)(lVar16 + 8);
                lVar23 = lVar23 + 0x20;
              } while (uVar18 < (ulong)(*(long *)(lVar16 + 0x10) - lVar12 >> 5));
            }
          }
        }
      } while ((*hadError != true) &&
              (p_Var11 = (_Base_ptr)std::_Rb_tree_increment(p_Var11), p_Var11 != local_130));
    }
  }
  goto LAB_003f2b0b;
  while( true ) {
    if (uVar9 < 10000) goto LAB_003f29b9;
    bVar3 = uVar9 < 100000;
    uVar9 = uVar9 / 10000;
    uVar6 = uVar21 + 4;
    if (bVar3) break;
LAB_003f291f:
    uVar21 = uVar6;
    if (uVar9 < 100) {
      uVar21 = uVar21 - 2;
      goto LAB_003f29b9;
    }
    if (uVar9 < 1000) {
      uVar21 = uVar21 - 1;
      goto LAB_003f29b9;
    }
  }
  uVar21 = uVar21 + 1;
LAB_003f29b9:
  local_1a8[0] = local_198;
  std::__cxx11::string::_M_construct((ulong)local_1a8,(char)uVar21);
  std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_1a8[0],uVar21,uVar22);
  pcVar17 = "Uniform location should be equal for same uniforms: ";
  goto LAB_003f2a44;
  while( true ) {
    if (uVar9 < 10000) goto LAB_003f2a01;
    bVar3 = uVar9 < 100000;
    uVar9 = uVar9 / 10000;
    uVar6 = uVar21 + 4;
    if (bVar3) break;
LAB_003f297a:
    uVar21 = uVar6;
    if (uVar9 < 100) {
      uVar21 = uVar21 - 2;
      goto LAB_003f2a01;
    }
    if (uVar9 < 1000) {
      uVar21 = uVar21 - 1;
      goto LAB_003f2a01;
    }
  }
  uVar21 = uVar21 + 1;
LAB_003f2a01:
  local_1a8[0] = local_198;
  std::__cxx11::string::_M_construct((ulong)local_1a8,(char)uVar21);
  std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_1a8[0],uVar21,uVar22);
  pcVar17 = "Uniform location overlaps across stages: ";
LAB_003f2a44:
  plVar15 = (long *)std::__cxx11::string::replace((ulong)local_1a8,0,(char *)0x0,(ulong)pcVar17);
  pTVar1 = (TPoolAllocator *)(plVar15 + 2);
  if ((TPoolAllocator *)*plVar15 == pTVar1) {
    local_1d0._16_8_ = pTVar1->pageSize;
    aStack_1b8._M_allocated_capacity = plVar15[3];
    local_1d0._0_8_ = (TPoolAllocator *)(local_1d0 + 0x10);
  }
  else {
    local_1d0._16_8_ = pTVar1->pageSize;
    local_1d0._0_8_ = (TPoolAllocator *)*plVar15;
  }
  __s = local_1d0._0_8_;
  local_1d0._8_8_ = plVar15[1];
  *plVar15 = (long)pTVar1;
  plVar15[1] = 0;
  *(undefined1 *)(plVar15 + 2) = 0;
  local_1d8.allocator = GetThreadPoolAllocator();
  std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
  basic_string<glslang::std::allocator<char>>
            ((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *)&local_168,
             (char *)__s,&local_1d8);
  if ((TPoolAllocator *)local_1d0._0_8_ != (TPoolAllocator *)(local_1d0 + 0x10)) {
    operator_delete((void *)local_1d0._0_8_,local_1d0._16_8_ + 1);
  }
  if (local_1a8[0] != local_198) {
    operator_delete(local_1a8[0],(ulong)((long)&local_198[0]->lastAllocation + 1));
  }
  TInfoSinkBase::message(&local_1e8->infoSink->info,EPrefixInternalError,local_168._M_dataplus._M_p)
  ;
  *hadError = true;
LAB_003f2b0b:
  lVar16 = local_138 + 1;
  if (lVar16 == 0xe) {
    if (local_128.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_128.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_128.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_128.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    if (local_188.super__Vector_base<glslang::TRange,_std::allocator<glslang::TRange>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_188.
                      super__Vector_base<glslang::TRange,_std::allocator<glslang::TRange>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_188.
                            super__Vector_base<glslang::TRange,_std::allocator<glslang::TRange>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_188.
                            super__Vector_base<glslang::TRange,_std::allocator<glslang::TRange>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>_>_>
    ::_M_erase(&local_60,(_Link_type)local_60._M_impl.super__Rb_tree_header._M_header._M_parent);
    return;
  }
  goto LAB_003f2534;
}

Assistant:

TSymbolValidater(TIoMapResolver& r, TInfoSink& i, TVarLiveMap* in[EShLangCount], TVarLiveMap* out[EShLangCount],
                     TVarLiveMap* uniform[EShLangCount], bool& hadError, EProfile profile, int version)
        : resolver(r)
        , infoSink(i)
        , hadError(hadError)
        , profile(profile)
        , version(version)
    {
        memcpy(inVarMaps, in, EShLangCount * (sizeof(TVarLiveMap*)));
        memcpy(outVarMaps, out, EShLangCount * (sizeof(TVarLiveMap*)));
        memcpy(uniformVarMap, uniform, EShLangCount * (sizeof(TVarLiveMap*)));

        std::map<TString, TString> anonymousMemberMap;
        std::vector<TRange> usedUniformLocation;
        std::vector<TString> usedUniformName;
        usedUniformLocation.clear();
        usedUniformName.clear();
        for (int i = 0; i < EShLangCount; i++) {
            if (uniformVarMap[i]) {
                for (auto uniformVar : *uniformVarMap[i])
                {
                    TIntermSymbol* pSymbol = uniformVar.second.symbol;
                    TQualifier qualifier = uniformVar.second.symbol->getQualifier();
                    TString symbolName = pSymbol->getAccessName();

                    // All the uniform needs multi-stage location check (block/default)
                    int uniformLocation = qualifier.layoutLocation;

                    if (uniformLocation != TQualifier::layoutLocationEnd) {
                        // Total size of current uniform, could be block, struct or other types.
                        int size = TIntermediate::computeTypeUniformLocationSize(pSymbol->getType());

                        TRange locationRange(uniformLocation, uniformLocation + size - 1);

                        // Combine location and component ranges
                        int overlapLocation = -1;
                        bool diffLocation = false;

                        // Check for collisions, except for vertex inputs on desktop targeting OpenGL
                        overlapLocation = checkLocationOverlap(locationRange, usedUniformLocation, symbolName, usedUniformName, diffLocation);

                        // Overlap locations of uniforms, regardless of components (multi stages)
                        if (overlapLocation == -1) {
                            usedUniformLocation.push_back(locationRange);
                            usedUniformName.push_back(symbolName);
                        }
                        else if (overlapLocation >= 0) {
                            if (diffLocation == true) {
                                TString err = ("Uniform location should be equal for same uniforms: " +std::to_string(overlapLocation)).c_str();
                                infoSink.info.message(EPrefixInternalError, err.c_str());
                                hadError = true;
                                break;
                            }
                            else {
                                TString err = ("Uniform location overlaps across stages: " + std::to_string(overlapLocation)).c_str();
                                infoSink.info.message(EPrefixInternalError, err.c_str());
                                hadError = true;
                                break;
                            }
                        }
                    }

                    if ((uniformVar.second.symbol->getBasicType() == EbtBlock) &&
                        IsAnonymous(uniformVar.second.symbol->getName()))
                    {
                        auto blockType = uniformVar.second.symbol->getType().getStruct();
                        for (size_t memberIdx = 0; memberIdx < blockType->size(); ++memberIdx) {
                            auto memberName = (*blockType)[memberIdx].type->getFieldName();
                            if (anonymousMemberMap.find(memberName) != anonymousMemberMap.end())
                            {
                                if (anonymousMemberMap[memberName] != uniformVar.second.symbol->getType().getTypeName())
                                {
                                    TString err = "Invalid block member name: " + memberName;
                                    infoSink.info.message(EPrefixInternalError, err.c_str());
                                    hadError = true;
                                    break;
                                }
                            }
                            else
                            {
                                anonymousMemberMap[memberName] = uniformVar.second.symbol->getType().getTypeName();
                            }
                        }
                    }
                    if (hadError)
                        break;
                }
            }
        }
    }